

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marker-index.cc
# Opt level: O0

void __thiscall
MarkerIndex::Iterator::find_ending_in(Iterator *this,Point *start,Point *end,MarkerIdSet *result)

{
  MarkerIdSet *this_00;
  bool local_51;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_48;
  const_iterator local_40;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_38;
  const_iterator local_30;
  MarkerIdSet *local_28;
  MarkerIdSet *result_local;
  Point *end_local;
  Point *start_local;
  Iterator *this_local;
  
  local_28 = result;
  result_local = (MarkerIdSet *)end;
  end_local = start;
  start_local = (Point *)this;
  reset(this);
  if (this->current_node != (Node *)0x0) {
    seek_to_first_node_greater_than_or_equal_to(this,end_local);
    while( true ) {
      local_51 = false;
      if (this->current_node != (Node *)0x0) {
        local_51 = Point::operator<=(&this->current_node_position,(Point *)result_local);
      }
      this_00 = local_28;
      if (local_51 == false) break;
      local_38._M_current =
           (uint *)flat_set<unsigned_int>::begin(&this->current_node->end_marker_ids);
      __gnu_cxx::
      __normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>
      ::__normal_iterator<unsigned_int*>
                ((__normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>
                  *)&local_30,&local_38);
      local_48._M_current = (uint *)flat_set<unsigned_int>::end(&this->current_node->end_marker_ids)
      ;
      __gnu_cxx::
      __normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>
      ::__normal_iterator<unsigned_int*>
                ((__normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>
                  *)&local_40,&local_48);
      flat_set<unsigned_int>::insert(this_00,local_30,local_40);
      cache_node_position(this);
      move_to_successor(this);
    }
  }
  return;
}

Assistant:

void MarkerIndex::Iterator::find_ending_in(const Point &start, const Point &end, MarkerIdSet *result) {
  reset();

  if (!current_node) return;

  seek_to_first_node_greater_than_or_equal_to(start);

  while (current_node && current_node_position <= end) {
    result->insert(current_node->end_marker_ids.begin(), current_node->end_marker_ids.end());
    cache_node_position();
    move_to_successor();
  }
}